

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O0

string * db_change_to_string_abi_cxx11_(DbChangeType change)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffffb0;
  allocator<char> *paVar1;
  char *in_stack_ffffffffffffffb8;
  string *psVar2;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d [13];
  
  switch(in_ESI) {
  case 1:
    paVar1 = local_d;
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,(char *)paVar1,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(local_d);
    break;
  case 2:
    paVar1 = local_1d;
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar2,in_stack_ffffffffffffffb8,paVar1);
    std::allocator<char>::~allocator(local_1d);
    break;
  case 3:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case 4:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_20);
    break;
  case 5:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 6:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_22);
    break;
  case 7:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_1f);
    break;
  default:
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_23);
  }
  return in_RDI;
}

Assistant:

std::string db_change_to_string(DbChangeType change) {
    switch (change) {
        case DbChangeType::Insert:
            return "INSERT";
        case DbChangeType::Drop:
            return "DROP";
        case DbChangeType::Reload:
            return "RELOAD";
        case DbChangeType::ConfigChange:
            return "CONFIG_CHANGE";
        case DbChangeType::ToggleTaint:
            return "TOGGLE_TAINT";
        case DbChangeType::NewIterator:
            return "NEW_ITERATOR";
        case DbChangeType::UpdateIterator:
            return "UPDATE_ITERATOR";
    }
    return "<invalid?>";
}